

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.h
# Opt level: O2

void __thiscall
cppcms::impl::
handler_binder_p1<void_(cppcms::impl::cgi::connection::*)(const_booster::callback<void_()>_&),_std::shared_ptr<cppcms::impl::cgi::connection>,_booster::callback<void_()>_>
::handler_binder_p1(handler_binder_p1<void_(cppcms::impl::cgi::connection::*)(const_booster::callback<void_()>_&),_std::shared_ptr<cppcms::impl::cgi::connection>,_booster::callback<void_()>_>
                    *this,offset_in_connection_to_subr *f,
                   shared_ptr<cppcms::impl::cgi::connection> *s,callback<void_()> *p1)

{
  offset_in_connection_to_subr oVar1;
  
  booster::callable<void_()>::callable(&this->super_callable_type);
  (this->super_callable_type).super_refcounted._vptr_refcounted =
       (_func_int **)&PTR__handler_binder_p1_002b30a8;
  oVar1 = f[1];
  this->f_ = *f;
  *(offset_in_connection_to_subr *)&this->field_0x18 = oVar1;
  std::__shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->s_).
              super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>,
             &s->super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>);
  booster::intrusive_ptr<booster::callable<void_()>_>::intrusive_ptr
            (&(this->p1_).call_ptr,&p1->call_ptr);
  return;
}

Assistant:

handler_binder_p1(F const &f,S const &s, P1 const &p1) : f_(f), s_(s), p1_(p1) {}